

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int descend(saucy *s,coloring *c,int target,int min)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar6;
  int iVar7;
  int iVar8;
  saucy *psVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  
  iVar6 = c->clen[target] + target;
  piVar2 = &s->stats->nodes;
  *piVar2 = *piVar2 + 1;
  swap_labels(c,min,iVar6);
  s->difflev[s->lev] = s->ndiffs;
  s->undifflev[s->lev] = s->nundiffs;
  s->lev = s->lev + 1;
  (*s->split)(s,c,target,iVar6);
  psVar9 = s;
  iVar6 = refineByDepGraph(s,c);
  iVar8 = (int)psVar9;
  iVar7 = 0;
  if (iVar6 != 0) {
    if (s->fBooleanMatching != 0) {
      psVar9 = s;
      iVar6 = check_OPP_for_Boolean_matching(s,c);
      iVar8 = (int)psVar9;
      if (iVar6 == 0) {
        return 0;
      }
      if (s->fBooleanMatching != 0) {
        psVar9 = s;
        iVar6 = check_OPP_for_Boolean_matching(s,c);
        iVar8 = (int)psVar9;
        if (iVar6 == 0) {
          return 0;
        }
      }
    }
    if ((s->fLookForSwaps != 0) && (&s->left != c)) {
      p = Vec_IntAlloc(iVar8);
      p_00 = Vec_IntAlloc(iVar8);
      for (iVar6 = 0; iVar6 < s->n; iVar6 = iVar6 + (s->left).clen[lVar14] + 1) {
        lVar14 = (long)iVar6;
        for (lVar12 = lVar14; lVar12 <= (s->left).clen[lVar14] + lVar14; lVar12 = lVar12 + 1) {
          Vec_IntPush(p,(s->left).cfront[(s->right).lab[lVar12]]);
          Vec_IntPush(p_00,(s->right).cfront[(s->left).lab[lVar12]]);
        }
        Vec_IntSortUnsigned(p);
        Vec_IntSortUnsigned(p_00);
        iVar7 = p->nSize;
        iVar8 = 0;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        while (iVar7 != iVar8) {
          iVar4 = Vec_IntEntry(p,iVar8);
          iVar5 = Vec_IntEntry(p_00,iVar8);
          iVar8 = iVar8 + 1;
          if (iVar4 != iVar5) {
            Vec_IntFree(p);
            Vec_IntFree(p_00);
            return 0;
          }
        }
        p->nSize = 0;
        p_00->nSize = 0;
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
    }
    iVar7 = 1;
    if (&s->left != c) {
      lVar12 = (long)s->nsplits;
      while (lVar12 = lVar12 + -1, s->splitlev[(long)s->lev + -1] < lVar12) {
        piVar2 = s->adj;
        lVar11 = (long)c->lab[s->splitwho[lVar12]];
        iVar6 = 0;
        uVar10 = 0;
        for (lVar14 = (long)piVar2[lVar11]; lVar14 < piVar2[lVar11 + 1]; lVar14 = lVar14 + 1) {
          iVar6 = iVar6 + c->cfront[s->edg[lVar14]];
          uVar10 = uVar10 ^ c->cfront[s->edg[lVar14]];
        }
        piVar3 = (s->left).lab;
        lVar11 = (long)piVar3[s->splitwho[lVar12]];
        iVar7 = 0;
        uVar13 = 0;
        for (lVar14 = (long)piVar2[lVar11]; lVar14 < piVar2[lVar11 + 1]; lVar14 = lVar14 + 1) {
          uVar1 = (s->left).cfront[s->edg[lVar14]];
          iVar7 = iVar7 + uVar1;
          uVar13 = uVar13 ^ uVar1;
        }
        if (iVar6 != iVar7) {
          return 0;
        }
        if (uVar10 != uVar13) {
          return 0;
        }
        lVar14 = (long)c->lab[s->splitfrom[lVar12]];
        iVar6 = 0;
        uVar10 = 0;
        for (lVar11 = (long)piVar2[lVar14]; lVar11 < piVar2[lVar14 + 1]; lVar11 = lVar11 + 1) {
          iVar6 = iVar6 + c->cfront[s->edg[lVar11]];
          uVar10 = uVar10 ^ c->cfront[s->edg[lVar11]];
        }
        lVar14 = (long)piVar3[s->splitfrom[lVar12]];
        iVar7 = 0;
        uVar13 = 0;
        for (lVar11 = (long)piVar2[lVar14]; lVar11 < piVar2[lVar14 + 1]; lVar11 = lVar11 + 1) {
          uVar1 = (s->left).cfront[s->edg[lVar11]];
          iVar7 = iVar7 + uVar1;
          uVar13 = uVar13 ^ uVar1;
        }
        if (iVar6 != iVar7) {
          return 0;
        }
        if (uVar10 != uVar13) {
          return 0;
        }
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int
descend(struct saucy *s, struct coloring *c, int target, int min)
{
    int back = target + c->clen[target];

    /* Count this node */
    ++s->stats->nodes;

    /* Move the minimum label to the back */
    swap_labels(c, min, back);

    /* Split the cell */
    s->difflev[s->lev] = s->ndiffs;
    s->undifflev[s->lev] = s->nundiffs;
    ++s->lev;
    s->split(s, c, target, back);   

    /* Now go and do some work */
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);    
    if (!refineByDepGraph(s, c)) return 0;

    /* if we are looking for a Boolean matching, check the OPP and 
     * backtrack if the OPP maps part of one network to itself */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_1 && !s->refineBySim1(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2 && !s->refineBySim2(s, c)) return 0;

    /* do the check once more, maybe the check fails, now that refinement is complete */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    if (s->fLookForSwaps && !check_OPP_only_has_swaps(s, c)) return 0;

    if (!double_check_OPP_isomorphism(s, c)) return 0;
    
    return 1;
}